

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ProcessStatsConfig::ProcessStatsConfig
          (ProcessStatsConfig *this,ProcessStatsConfig *param_1)

{
  bool bVar1;
  undefined2 uVar2;
  uint32_t uVar3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ProcessStatsConfig_004075d8;
  std::
  vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ::vector(&this->quirks_,&param_1->quirks_);
  this->proc_stats_cache_ttl_ms_ = param_1->proc_stats_cache_ttl_ms_;
  bVar1 = param_1->record_thread_names_;
  uVar2 = *(undefined2 *)&param_1->field_0x22;
  uVar3 = param_1->proc_stats_poll_ms_;
  this->scan_all_processes_on_start_ = param_1->scan_all_processes_on_start_;
  this->record_thread_names_ = bVar1;
  *(undefined2 *)&this->field_0x22 = uVar2;
  this->proc_stats_poll_ms_ = uVar3;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ProcessStatsConfig::ProcessStatsConfig(const ProcessStatsConfig&) = default;